

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O1

void * ngx_http_fastcgi_create_main_conf(ngx_conf_t *cf)

{
  ngx_pool_t *pool;
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)ngx_pcalloc(cf->pool,0x28);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    pool = cf->pool;
    puVar1[1] = 0;
    puVar1[2] = 8;
    puVar1[3] = 4;
    puVar1[4] = pool;
    pvVar2 = ngx_palloc(pool,0x20);
    *puVar1 = pvVar2;
    if (pvVar2 == (void *)0x0) {
      puVar1 = (undefined8 *)0x0;
    }
  }
  return puVar1;
}

Assistant:

static void *
ngx_http_fastcgi_create_main_conf(ngx_conf_t *cf)
{
    ngx_http_fastcgi_main_conf_t  *conf;

    conf = ngx_pcalloc(cf->pool, sizeof(ngx_http_fastcgi_main_conf_t));
    if (conf == NULL) {
        return NULL;
    }

#if (NGX_HTTP_CACHE)
    if (ngx_array_init(&conf->caches, cf->pool, 4,
                       sizeof(ngx_http_file_cache_t *))
        != NGX_OK)
    {
        return NULL;
    }
#endif

    return conf;
}